

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hpp
# Opt level: O2

void __thiscall CJSON::ParseObject(CJSON *this,string *obj)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  undefined8 *puVar7;
  CJSONException *pCVar8;
  uint uVar9;
  char *beg;
  undefined4 local_bc;
  char *end;
  string local_b0;
  string Key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string Value;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)this);
  Key._M_dataplus._M_p = (pointer)&Key.field_2;
  Key._M_string_length = 0;
  bVar3 = false;
  Value._M_dataplus._M_p = (pointer)&Value.field_2;
  Value._M_string_length = 0;
  Key.field_2._M_local_buf[0] = '\0';
  Value.field_2._M_local_buf[0] = '\0';
  beg = (obj->_M_dataplus)._M_p;
  end = beg + obj->_M_string_length;
  local_bc = 2;
  bVar4 = false;
  bVar2 = false;
  do {
    if (beg == end) {
LAB_0012b57b:
      if ((!bVar2) || (*beg == '}')) {
        std::__cxx11::string::~string((string *)&Value);
        std::__cxx11::string::~string((string *)&Key);
        return;
      }
LAB_0012b5b3:
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      *puVar7 = &PTR__CJSONException_00143d20;
      puVar7[1] = puVar7 + 3;
      puVar7[2] = 0;
      *(undefined1 *)(puVar7 + 3) = 0;
      *(undefined4 *)(puVar7 + 5) = local_bc;
      __cxa_throw(puVar7,&CJSONException::typeinfo,CJSONException::~CJSONException);
    }
    bVar1 = *beg;
    uVar9 = (uint)bVar1;
    if (((uVar9 - 9 < 2) || (uVar9 - 0xc < 2)) || (uVar9 == 0x20)) {
LAB_0012b48a:
      if (bVar4) {
LAB_0012b524:
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->m_Values,&Key);
        std::__cxx11::string::_M_assign((string *)pmVar6);
        Key._M_string_length = 0;
        bVar3 = false;
        *Key._M_dataplus._M_p = '\0';
        Value._M_string_length = 0;
        *Value._M_dataplus._M_p = '\0';
      }
    }
    else {
      if (uVar9 == 0x22) {
        if (bVar2) {
          if (bVar4) {
            pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_b0,"Missing seperator \',\'.",(allocator<char> *)&local_70);
            CJSONException::CJSONException(pCVar8,&local_b0,MISSING_SEPERATOR);
            __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          if (Key._M_string_length == 0) {
            ParseString_abi_cxx11_(&local_b0,this,&beg,&end);
            std::__cxx11::string::operator=((string *)&Key,(string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            goto LAB_0012b48a;
          }
          if ((Value._M_string_length != 0) || (!bVar3)) {
            pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
            std::operator+(&local_70,"Missing seperator after \'",&Key);
            std::operator+(&local_b0,&local_70,"\'");
            CJSONException::CJSONException(pCVar8,&local_b0,MISSING_SEPERATOR);
            __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
          }
          ParseString_abi_cxx11_(&local_b0,this,&beg,&end);
          std::__cxx11::string::operator=((string *)&Value,(string *)&local_b0);
LAB_0012b51c:
          std::__cxx11::string::~string((string *)&local_b0);
          bVar4 = true;
          goto LAB_0012b524;
        }
        goto LAB_0012b5b3;
      }
      if (uVar9 != 0x2c) {
        if (uVar9 == 0x3a) {
          if (!bVar2) goto LAB_0012b5b3;
          bVar3 = true;
          if (Key._M_string_length != 0) goto LAB_0012b48a;
        }
        else {
          if ((uVar9 == 0x5b) || (uVar9 == 0x7b)) {
            if (!bVar2) {
              bVar2 = true;
              goto LAB_0012b48a;
            }
            if (Key._M_string_length == 0) goto LAB_0012b5ac;
            if (!bVar3) {
              pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
              std::operator+(&local_70,"Missing seperator after \'",&Key);
              std::operator+(&local_b0,&local_70,"\'");
              CJSONException::CJSONException(pCVar8,&local_b0,MISSING_SEPERATOR);
              __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
            }
            bVar4 = true;
            if (uVar9 == 0x5b) {
              ParseBracketStr_abi_cxx11_(&local_b0,this,'[',']',&beg,&end);
            }
            else {
              if (uVar9 != 0x7b) goto LAB_0012b524;
              ParseBracketStr_abi_cxx11_(&local_b0,this,'{','}',&beg,&end);
            }
            std::__cxx11::string::operator=((string *)&Value,(string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            goto LAB_0012b524;
          }
          if (uVar9 == 0x7d) goto LAB_0012b57b;
          if (!bVar2) goto LAB_0012b5b3;
          if (Key._M_string_length != 0) {
            if (!bVar3) {
              pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
              std::operator+(&local_70,"Missing seperator after \'",&Key);
              std::operator+(&local_b0,&local_70,"\'");
              CJSONException::CJSONException(pCVar8,&local_b0,MISSING_SEPERATOR);
              __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
            }
            if (bVar1 == 0x74) {
LAB_0012b352:
              ParseBool_abi_cxx11_(&local_b0,this,&beg,&end);
            }
            else if (bVar1 == 0x6e) {
              ParseNull_abi_cxx11_(&local_b0,this,&beg,&end);
            }
            else {
              if (bVar1 == 0x66) goto LAB_0012b352;
              iVar5 = isalnum((int)(char)bVar1);
              if (((iVar5 == 0) && (bVar1 != 0x2d)) && (bVar1 != 0x2b)) {
                pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
                std::operator+(&local_70,"Invalid type for key \'",&Key);
                std::operator+(&local_b0,&local_70,"\'");
                CJSONException::CJSONException(pCVar8,&local_b0,INVALID_TYPE);
                __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
              }
              ParseNum_abi_cxx11_(&local_b0,this,&beg,&end);
            }
            std::__cxx11::string::operator=((string *)&Value,(string *)&local_b0);
            goto LAB_0012b51c;
          }
        }
LAB_0012b5ac:
        local_bc = 10;
        goto LAB_0012b5b3;
      }
      if (!bVar2) goto LAB_0012b5b3;
      if (!bVar4) {
        pCVar8 = (CJSONException *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,"Lonly \',\'",(allocator<char> *)&local_70);
        CJSONException::CJSONException(pCVar8,&local_b0,WRONG_PLACED_SEPERATOR);
        __cxa_throw(pCVar8,&CJSONException::typeinfo,CJSONException::~CJSONException);
      }
      bVar4 = false;
    }
    if (beg != end) {
      beg = beg + 1;
    }
  } while( true );
}

Assistant:

inline void ParseObject(const std::string &obj)
        {
            m_Values.clear();
            std::string Key, Value;
            bool ValAllowed = false;
            bool KeyValueValid = false;
            bool ValidObject = false;

            /*
                Why we use raw pointers instead of iterators or an for loop?
                Because I think its much faster to use pointer arithmetic instead
                of iterator arithmetic or for loops.

                If I'm wrong with my thoughts, please correct me.
             */
            const char *beg = obj.c_str();
            const char *end = beg + obj.size();

            while (beg != end && *beg != '}')
            {
                switch (*beg)
                {
                    // Parses a string.
                    case '\"':
                    {
                        // Throw an exception if we found a string outside of an object.
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
                        else if(KeyValueValid)
                            throw CJSONException("Missing seperator ','.", JSONErrorType::MISSING_SEPERATOR);

                        // Quick and dirty check if we need a key or a value.
                        if(Key.empty())
                            Key = ParseString(beg, end);
                        else if(Value.empty() && ValAllowed)
                        {
                            ValAllowed = false;
                            KeyValueValid = true;
                            Value = ParseString(beg, end);
                        }
                        else   // Throw an exception if we doesn't expected a key or value. That occurs always if a colon is missing.
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);                            
                    }break;

                    // Ignore all whitespace characters, which are outside of values.
                    case '\t':
                    case '\n':
                    case '\f':
                    case '\r':
                    case ' ':
                    {

                    }break;

                    // Parses an object or array.
                    case '{':
                    case '[':
                    {
                        // If this is the root object then set the validator flag.
                        if(!ValidObject)
                        {
                            ValidObject = true;
                            break;
                        }

                        // Throws an exception either if the key is missing or a value wasn't expected.
                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        // Objects and arrays are saved as strings and parsed later.
                        if(*beg == '{')
                            Value = ParseBracketStr('{', '}', beg, end);
                        else if(*beg == '[')
                            Value = ParseBracketStr('[', ']', beg, end);
                    }break;

                    // Allows the next key value pair.
                    case ',': 
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(!KeyValueValid)
                            throw CJSONException("Lonly ','", JSONErrorType::WRONG_PLACED_SEPERATOR);        

                        KeyValueValid = false;
                    }break;

                    // Allows a value.
                    case ':':
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY);

                        ValAllowed = true;
                    }break;

                    default:
                    {
                        if(!ValidObject)
                            throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);

                        if(Key.empty())
                            throw CJSONException(JSONErrorType::MISSING_KEY); 
                        else if(!ValAllowed)
                            throw CJSONException("Missing seperator after '" + Key + "'", JSONErrorType::MISSING_SEPERATOR);  

                        ValAllowed = false;
                        KeyValueValid = true;

                        switch (*beg)
                        {
                            // If a non escaped string begins with t or f it's maybe a boolean.
                            case 't':
                            case 'f':
                            {
                                Value = ParseBool(beg, end);
                            }break;

                            // If a non escaped string begins with n it's maybe a null object.
                            case 'n':
                            {
                                Value = ParseNull(beg, end);
                            }break;

                            default:
                            {
                                // If a non escaped string begins with a number, plus or minus it's maybe a number.
                                if(isalnum(*beg) || *beg == '-' || *beg == '+')
                                    Value = ParseNum(beg, end);
                                else    // Otherwise throw an exception.
                                    throw CJSONException("Invalid type for key '" + Key + "'", JSONErrorType::INVALID_TYPE);
                            }break;
                        }
                    }break;
                }

                // If key and value is set save it for later use.
                if(KeyValueValid)
                {
                    ValAllowed = false;
                    m_Values[Key] = Value;
                    Key.clear();
                    Value.clear();
                }

                if(beg != end)
                    beg++;
            }

            // Validates the object.
            if(ValidObject && *beg != '}')
                throw CJSONException(JSONErrorType::INVALID_JSON_OBJECT);
        }